

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cLayoutBindingTests.cpp
# Opt level: O3

String * __thiscall
glcts::LayoutBindingProgram::stageToName_abi_cxx11_
          (String *__return_storage_ptr__,LayoutBindingProgram *this,eStageType stage)

{
  char *pcVar1;
  char *pcVar2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if (stage == VertexShader) {
    pcVar2 = "VertexShader";
    pcVar1 = "";
  }
  else if (stage == ComputeShader) {
    pcVar2 = "ComputeShader";
    pcVar1 = "";
  }
  else {
    if (stage != FragmentShader) {
      __return_storage_ptr__->_M_string_length = 0;
      (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
      return __return_storage_ptr__;
    }
    pcVar2 = "FragmentShader";
    pcVar1 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar2,pcVar1);
  return __return_storage_ptr__;
}

Assistant:

String stageToName(eStageType stage) const
	{
		switch (stage)
		{
		case FragmentShader:
			return "FragmentShader";
		case VertexShader:
			return "VertexShader";
		case ComputeShader:
			return "ComputeShader";
		default:
			DE_ASSERT(0);
			break;
		}
		return String();
	}